

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QList<QByteArray> * __thiscall
QHash<QByteArray,_QTzTimeZone>::keys
          (QList<QByteArray> *__return_storage_ptr__,QHash<QByteArray,_QTzTimeZone> *this)

{
  const_iterator i1;
  
  i1 = begin(this);
  QList<QByteArray>::QList<QHash<QByteArray,_QTzTimeZone>::key_iterator,_true>
            (__return_storage_ptr__,(key_iterator)i1.i,(key_iterator)ZEXT816(0));
  return __return_storage_ptr__;
}

Assistant:

QList<Key> keys() const { return QList<Key>(keyBegin(), keyEnd()); }